

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::Read3dmV1Layer(ON_BinaryArchive *this,ON_Layer **layer)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ON_Layer *pOVar4;
  wchar_t *component_name;
  char *pcVar5;
  ON__3dmV1LayerIndex *pOVar6;
  byte bVar7;
  ON__UINT32 tcode;
  ON_String s;
  ON__INT64 big_value;
  int slen;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_3c;
  ON_wString local_38;
  
  ON_String::ON_String(&s);
  do {
    tcode = 0;
    big_value = 0;
    bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
    if (!bVar1) break;
    if (tcode == 0x400010) {
      pOVar4 = (ON_Layer *)operator_new(0xe8);
      ON_Layer::ON_Layer(pOVar4);
      *layer = pOVar4;
      iVar3 = this->m_3dm_v1_layer_index;
      this->m_3dm_v1_layer_index = iVar3 + 1;
      bVar1 = true;
      ON_ModelComponent::SetIndex((ON_ModelComponent *)pOVar4,iVar3);
      goto LAB_003cfefd;
    }
    bVar1 = EndRead3dmChunk(this);
  } while (bVar1);
  bVar1 = false;
LAB_003cfefd:
  if (*layer != (ON_Layer *)0x0) {
    do {
      tcode = 0;
      big_value = 0;
      bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
      if (!bVar1) {
LAB_003d0080:
        bVar7 = 0;
        goto LAB_003d0082;
      }
      if (tcode == 0x80400001) {
        pOVar4 = *layer;
        ON_Color::ON_Color((ON_Color *)&local_3c,(uint)big_value);
        ON_Layer::SetColor(pOVar4,(ON_Color)local_3c);
      }
      else if (tcode == 0x80400033) {
        bVar1 = big_value == 2;
        if (bVar1) {
          ON_Layer::SetVisible(*layer,true);
        }
        else {
          ON_Layer::SetVisible(*layer,big_value != 1);
        }
        ON_Layer::SetLocked(*layer,bVar1);
      }
      else if (tcode == 0x400011) {
        slen = 0;
        ReadInt(this,&slen);
        if ((ulong)(uint)slen < 0x2711) {
          ON_String::SetLength(&s,(ulong)(uint)slen);
          iVar3 = ON_String::Length(&s);
          pcVar5 = ON_String::Array(&s);
          bVar1 = ReadByte(this,(long)iVar3,pcVar5);
          if (bVar1) {
            pOVar4 = *layer;
            ON_wString::ON_wString(&local_38,&s);
            component_name = ON_wString::operator_cast_to_wchar_t_(&local_38);
            ON_ModelComponent::SetName(&pOVar4->super_ON_ModelComponent,component_name);
            ON_wString::~ON_wString(&local_38);
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x27eb,"","ON_BinaryArchive::Read3dmV1Layer() - invalid layer name length");
        }
      }
      bVar1 = EndRead3dmChunk(this);
      if (!bVar1) goto LAB_003d0080;
    } while (tcode != 0xffffffff);
    bVar7 = 1;
LAB_003d0082:
    bVar1 = EndRead3dmChunk(this);
    pOVar4 = *layer;
    if ((bVar7 & bVar1) == 0) {
      if (pOVar4 != (ON_Layer *)0x0) {
        (*(pOVar4->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
        *layer = (ON_Layer *)0x0;
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if ((((pOVar4 != (ON_Layer *)0x0) &&
           (ON_ModelComponent::SetId(&pOVar4->super_ON_ModelComponent), this->m_mode == read3dm)) &&
          (this->m_3dm_opennurbs_version == 0)) && (this->m_3dm_version == 1)) {
        uVar2 = ON_String::Length(&s);
        pcVar5 = ON_String::Array(&s);
        iVar3 = ON_ModelComponent::Index(&(*layer)->super_ON_ModelComponent);
        if (((pcVar5 != (char *)0x0) && (uVar2 - 1 < 0xff)) && ((-1 < iVar3 && (*pcVar5 != '\0'))))
        {
          pOVar6 = (ON__3dmV1LayerIndex *)oncalloc(1,(ulong)(uVar2 + 0x19));
          pOVar6->m_layer_name = (char *)(pOVar6 + 1);
          iVar3 = ON_ModelComponent::Index(&(*layer)->super_ON_ModelComponent);
          pOVar6->m_layer_index = iVar3;
          pOVar6->m_layer_name_length = uVar2;
          memcpy(pOVar6->m_layer_name,pcVar5,(ulong)uVar2);
          pOVar6->m_layer_name[uVar2] = '\0';
          pOVar6->m_next = this->m_V1_layer_list;
          this->m_V1_layer_list = pOVar6;
        }
      }
    }
  }
  ON_String::~ON_String(&s);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::Read3dmV1Layer( ON_Layer*& layer )
{
  ON_String s;
  bool rc = 0;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  for (;;) 
  {
    tcode = 0;
    big_value = 0;
    if (!BeginRead3dmBigChunk(&tcode,&big_value))
      break; // assume we are at the end of the file
    if ( tcode == TCODE_LAYER ) {
      layer = new ON_Layer();
      layer->SetIndex(m_3dm_v1_layer_index++);
      rc = 1;
      break;
    }
    if (!EndRead3dmChunk())
       break;
  }
  if ( layer ) {
    rc = false;
    for (;;) 
    {
      tcode = 0;
      big_value = 0;
      if (!BeginRead3dmBigChunk(&tcode,&big_value))
        break;
      switch(tcode) 
      {
      case TCODE_LAYERNAME:
        {
          int slen = 0;
          ReadInt(&slen);
          if ( slen < 0 || slen > 10000 )
          {
            ON_ERROR("ON_BinaryArchive::Read3dmV1Layer() - invalid layer name length");
          }
          else
          {
            s.SetLength(slen);
            if ( ReadByte( s.Length(), s.Array() ) )
            {
              layer->SetName(ON_wString(s));
            }
          }
        }
        break;
      case TCODE_RGB:
        {
          ON__UINT64 rgb64 = (ON__UINT64)big_value;
          ON__UINT32 rgb32 = (ON__UINT32)rgb64;
          layer->SetColor( ON_Color((ON__UINT32)rgb32) );
        }
        break;
      case TCODE_LAYERSTATE:
        switch (big_value) 
        {
        case 1: // hidden
          layer->SetVisible(false);
          layer->SetLocked(false);
          break;
        case 2: // locked
          layer->SetVisible(true);
          layer->SetLocked(true);
          break;
        default: // normal
          layer->SetVisible(true);
          layer->SetLocked(false);
          break;
        }
        break;
      }
      if (!EndRead3dmChunk())
         break;
      if ( TCODE_ENDOFTABLE == tcode ) {
        rc = true;
        break;
      }
    }
    if ( !EndRead3dmChunk() ) // end of TCODE_LAYER chunk
      rc = false;
  }
  if ( !rc && layer ) 
  {
    delete layer;
    layer = 0;
  }
  else if (rc && layer)
  {
    // V1 files did not have layer ids.
    layer->SetId();
    if (    ON::archive_mode::read3dm == m_mode
         && 0 == m_3dm_opennurbs_version
         && 1 == m_3dm_version
         )
    {
      // save layer index and name in a linked list.
      int s_length = s.Length();
      const char* s_name = s.Array();
      if (    layer->Index() >= 0
           && s_length > 0
           && s_length < 256
           && 0 != s_name
           && 0 != s_name[0] 
         )
      {
        struct ON__3dmV1LayerIndex* p = (struct ON__3dmV1LayerIndex*)oncalloc(1, sizeof(*p) + (s_length+1)*sizeof(*p->m_layer_name) );
        p->m_layer_name = (char*)(p+1);
        p->m_layer_index = layer->Index();
        p->m_layer_name_length = s_length;
        memcpy(p->m_layer_name,s_name,s_length*sizeof(*p->m_layer_name));
        p->m_layer_name[s_length] = 0;
        p->m_next = m_V1_layer_list;
        m_V1_layer_list = p;
      }
    }
  }
  return rc;
}